

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue.hpp
# Opt level: O0

int __thiscall
lf_queue<ll_el<unsigned_int,_unsigned_int>_>::remove
          (lf_queue<ll_el<unsigned_int,_unsigned_int>_> *this,char *__filename)

{
  uint uVar1;
  uint extraout_EAX;
  uint uVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  reference this_00;
  size_type sVar5;
  h_el_t el;
  itype in_stack_0000005c;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> *in_stack_00000060;
  key_type *in_stack_ffffffffffffffc8;
  
  pmVar3 = std::
           unordered_map<std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>_>
           ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>_>
                         *)this,in_stack_ffffffffffffffc8);
  uVar1 = pmVar3->F_ab;
  std::
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>_>
  ::erase((unordered_map<std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>_>
           *)this,in_stack_ffffffffffffffc8);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->F_size,(ulong)uVar1);
  *pvVar4 = *pvVar4 - 1;
  this->current_size = this->current_size - 1;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->F_size,(ulong)uVar1);
  uVar2 = *pvVar4;
  this_00 = std::
            vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            ::operator[](&this->F,(ulong)uVar1);
  sVar5 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::size(this_00);
  if ((ulong)uVar2 < sVar5 >> 1) {
    compact_ll(in_stack_00000060,in_stack_0000005c);
    uVar2 = extraout_EAX;
  }
  return uVar2;
}

Assistant:

void remove(cpair ab){

		assert(contains(ab));
		assert(max_size>0);

		h_el_t el = H[ab];
		H.erase(ab);//remove pair from hash

		assert(F_size[el.F_ab]>0);
		F_size[el.F_ab]--;

		assert(current_size>0);
		current_size--;

		//if more than half of B's entries are empty, compact B.
		if(F_size[el.F_ab] < F[el.F_ab].size()/2)
			compact_ll(el.F_ab);

	}